

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_net.cpp
# Opt level: O2

bool I_InitNetwork(void)

{
  long lVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  char *pcVar5;
  long lVar6;
  bool bVar7;
  
  memset(&doomcom,0,0x36c4);
  pcVar5 = DArgs::CheckValue(Args,"-dup");
  if (pcVar5 == (char *)0x0) {
    doomcom.ticdup = 1;
  }
  else {
    iVar2 = atoi(pcVar5);
    iVar4 = 5;
    if (iVar2 < 5) {
      iVar4 = iVar2;
    }
    iVar2 = 1;
    if (1 < iVar4) {
      iVar2 = iVar4;
    }
    doomcom.ticdup = (SWORD)iVar2;
  }
  pcVar5 = DArgs::CheckValue(Args,"-port");
  if (pcVar5 != (char *)0x0) {
    uVar3 = atoi(pcVar5);
    DOOMPORT = (u_short)uVar3;
    Printf("using alternate port %i\n",(ulong)(uVar3 & 0xffff));
  }
  iVar4 = DArgs::CheckParm(Args,"-host",1);
  if (iVar4 == 0) {
    iVar4 = DArgs::CheckParm(Args,"-join",1);
    if (iVar4 == 0) {
      doomcom.id = 0x12345678;
      doomcom.numnodes = 1;
      doomcom.consoleplayer = 0;
      doomcom.numplayers = 1;
      netgame = false;
      multiplayer = false;
      return false;
    }
    JoinGame(iVar4);
  }
  else {
    HostGame(iVar4);
  }
  if (doomcom.numnodes < 3) {
    bVar7 = false;
  }
  else {
    bVar7 = true;
    if ((doomcom.numnodes == 3) && (iVar4 = PrivateNetOf(sendaddress[1].sin_addr), iVar4 != 0)) {
      lVar6 = 0;
      do {
        lVar1 = lVar6 + 0x10;
        bVar7 = lVar1 != 0x20;
        if (lVar1 == 0x20) {
          return bVar7;
        }
        iVar2 = PrivateNetOf((in_addr)*(in_addr_t *)(sendaddress[2].sin_zero + lVar6 + -4));
        lVar6 = lVar1;
      } while (iVar2 == iVar4);
    }
  }
  return bVar7;
}

Assistant:

bool I_InitNetwork (void)
{
	int i;
	const char *v;

	memset (&doomcom, 0, sizeof(doomcom));

	// set up for network
	v = Args->CheckValue ("-dup");
	if (v)
	{
		doomcom.ticdup = clamp (atoi (v), 1, MAXTICDUP);
	}
	else
	{
		doomcom.ticdup = 1;
	}

	v = Args->CheckValue ("-port");
	if (v)
	{
		DOOMPORT = atoi (v);
		Printf ("using alternate port %i\n", DOOMPORT);
	}

	// parse network game options,
	//		player 1: -host <numplayers>
	//		player x: -join <player 1's address>
	if ( (i = Args->CheckParm ("-host")) )
	{
		HostGame (i);
	}
	else if ( (i = Args->CheckParm ("-join")) )
	{
		JoinGame (i);
	}
	else
	{
		// single player game
		netgame = false;
		multiplayer = false;
		doomcom.id = DOOMCOM_ID;
		doomcom.numplayers = doomcom.numnodes = 1;
		doomcom.consoleplayer = 0;
		return false;
	}
	if (doomcom.numnodes < 3)
	{ // Packet server mode with only two players is effectively the same as
	  // peer-to-peer but with some slightly larger packets.
		return false;
	}
	return doomcom.numnodes > 3 || !NodesOnSameNetwork();
}